

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

HttpMethod * __thiscall
kj::_::NullableValue<kj::HttpMethod>::emplace<kj::HttpMethod&>
          (NullableValue<kj::HttpMethod> *this,HttpMethod *params)

{
  HttpMethod *params_00;
  HttpMethod *params_local;
  NullableValue<kj::HttpMethod> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::HttpMethod>(&(this->field_1).value);
  }
  params_00 = fwd<kj::HttpMethod&>(params);
  ctor<kj::HttpMethod,kj::HttpMethod&>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (HttpMethod *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }